

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

void __thiscall ON_wString::CopyArray(ON_wString *this)

{
  ON_Internal_Empty_wString *hdr;
  wchar_t *s;
  ON_Internal_Empty_wString *pOVar1;
  
  s = this->m_s;
  hdr = (ON_Internal_Empty_wString *)(s + -3);
  if ((hdr != &empty_wstring && s != (wchar_t *)0x0) &&
     (1 < (hdr->header).ref_count.super___atomic_base<int>._M_i)) {
    this->m_s = (wchar_t *)0x84a45c;
    CopyToArray(this,s[-1],s);
    if (s[-2] < s[-1]) {
      pOVar1 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar1 = &empty_wstring;
      }
      (pOVar1->header).string_length = s[-2];
    }
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero((ON_wStringHeader *)hdr);
    return;
  }
  return;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}